

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

bool ON_Locale::SetCurrentCulture(ON_Locale *current_culture_locale)

{
  char *pcVar1;
  char *__locale;
  char buffer [128];
  
  memcpy(&m_CurrentCulture,current_culture_locale,0x9c);
  buffer[0x70] = '\0';
  buffer[0x71] = '\0';
  buffer[0x72] = '\0';
  buffer[0x73] = '\0';
  buffer[0x74] = '\0';
  buffer[0x75] = '\0';
  buffer[0x76] = '\0';
  buffer[0x77] = '\0';
  buffer[0x78] = '\0';
  buffer[0x79] = '\0';
  buffer[0x7a] = '\0';
  buffer[0x7b] = '\0';
  buffer[0x7c] = '\0';
  buffer[0x7d] = '\0';
  buffer[0x7e] = '\0';
  buffer[0x7f] = '\0';
  buffer[0x60] = '\0';
  buffer[0x61] = '\0';
  buffer[0x62] = '\0';
  buffer[99] = '\0';
  buffer[100] = '\0';
  buffer[0x65] = '\0';
  buffer[0x66] = '\0';
  buffer[0x67] = '\0';
  buffer[0x68] = '\0';
  buffer[0x69] = '\0';
  buffer[0x6a] = '\0';
  buffer[0x6b] = '\0';
  buffer[0x6c] = '\0';
  buffer[0x6d] = '\0';
  buffer[0x6e] = '\0';
  buffer[0x6f] = '\0';
  buffer[0x50] = '\0';
  buffer[0x51] = '\0';
  buffer[0x52] = '\0';
  buffer[0x53] = '\0';
  buffer[0x54] = '\0';
  buffer[0x55] = '\0';
  buffer[0x56] = '\0';
  buffer[0x57] = '\0';
  buffer[0x58] = '\0';
  buffer[0x59] = '\0';
  buffer[0x5a] = '\0';
  buffer[0x5b] = '\0';
  buffer[0x5c] = '\0';
  buffer[0x5d] = '\0';
  buffer[0x5e] = '\0';
  buffer[0x5f] = '\0';
  buffer[0x40] = '\0';
  buffer[0x41] = '\0';
  buffer[0x42] = '\0';
  buffer[0x43] = '\0';
  buffer[0x44] = '\0';
  buffer[0x45] = '\0';
  buffer[0x46] = '\0';
  buffer[0x47] = '\0';
  buffer[0x48] = '\0';
  buffer[0x49] = '\0';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '\0';
  buffer[0x4c] = '\0';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x4f] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  pcVar1 = GetBCP47LanguageTag(current_culture_locale,buffer,0x80);
  if (pcVar1 == (char *)0x0) {
    __locale = "C";
  }
  else {
    __locale = "C";
    if (*pcVar1 != '\0') {
      __locale = pcVar1;
    }
  }
  setlocale(6,__locale);
  setlocale(1,"C");
  return true;
}

Assistant:

bool ON_Locale::SetCurrentCulture(
  const ON_Locale& current_culture_locale
  )
{
  ON_Locale::m_CurrentCulture = current_culture_locale;

  char buffer[ON_Locale::BUFFER_MAXIMUM_CAPACITY] = { 0 };
  size_t buffer_capacity = sizeof(buffer) / sizeof(buffer[0]);
  const char* s = nullptr;

  if (false == current_culture_locale.IsOrdinalOrInvariantCulture())
  {
#if defined(ON_RUNTIME_WIN)
    // Windows sometimes appends _<sortorder>
    s = current_culture_locale.GetWindowsLocaleName(buffer,buffer_capacity);
#elif defined(ON_RUNTIME_APPLE)
    // Apple puts an _ before <REGION>
    s = current_culture_locale.GetAppleLocaleName(buffer,buffer_capacity);
#else
    // The current "standard" ?
    s = current_culture_locale.GetBCP47LanguageTag(buffer, buffer_capacity);
#endif
  }

  // String collate and mapping functions should use the locale for the name.
  if ( nullptr == s || 0 == s[0] )
  {
    setlocale(LC_ALL,"C");
  }
  else
  {
    setlocale(LC_ALL,s);
  }

  // number parsing and formatting use a decimal point in all cases.
  setlocale(LC_NUMERIC,"C");

  return true;
}